

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O1

void KConfigExport::dump_source(MetaConfiguration *conf,string *filename)

{
  MetaClass *top;
  ostream *poVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  path path;
  ofstream source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string_type local_288;
  path local_268;
  path local_240;
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(string *)filename,_S_out);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_240,filename,auto_format);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"// clang-format off",0x13);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  dump_notice((ofstream *)&local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"#include \"",10);
  auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar3._8_8_ == 0 || auVar3._0_8_ == 0) {
    std::filesystem::__cxx11::path::path(&local_268);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_288,auVar3._0_8_);
    std::filesystem::__cxx11::path::path(&local_268,&local_288,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_2a8,&local_268,(allocator<char> *)&local_288);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_218,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".h\"",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_268);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"#include <KConfig>",0x12);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"#include <KConfigGroup>",0x17);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"#include <KSharedConfig>",0x18);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  std::ios::widen((char)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  if ((conf->conf_namespace)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"namespace ",10);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_218,(conf->conf_namespace)._M_dataplus._M_p,
                        (conf->conf_namespace)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," {",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  top = (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (top != (MetaClass *)0x0) {
    anon_unknown.dwarf_6644d::dump_source_class(top,(ofstream *)&local_218);
  }
  if ((conf->conf_namespace)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218,"}",1);
    std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
    std::ostream::put((char)&local_218);
    std::ostream::flush();
  }
  std::ios::widen((char)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218,"// clang-format on",0x12);
  std::ios::widen((char)(ostream *)&local_218 + (char)*(undefined8 *)(local_218 + -0x18));
  std::ostream::put((char)&local_218);
  std::ostream::flush();
  std::filesystem::__cxx11::path::~path(&local_240);
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _operator<<;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void dump_source(const MetaConfiguration &conf, const std::string &filename)
{
  std::ofstream source(filename);
  std::filesystem::path path(filename);

  source << "// clang-format off" << std::endl;

  dump_notice(source);

  source << "#include \"" << path.stem().generic_string() << ".h\""
         << std::endl;
  source << "#include <KConfig>" << std::endl;
  source << "#include <KConfigGroup>" << std::endl;
  source << "#include <KSharedConfig>" << std::endl;

  source << std::endl;

  if (conf.conf_namespace.size()) {
    source << "namespace " << conf.conf_namespace << " {" << std::endl
           << std::endl;
  }

  if (conf.top_level_class) {
    dump_source_class(conf.top_level_class.get(), source);
  }

  if (conf.conf_namespace.size()) {
    source << "}" << std::endl;
  }

  source << std::endl;
  source << "// clang-format on" << std::endl;

}